

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_validation.c
# Opt level: O3

REF_STATUS ref_validation_unused_node(REF_GRID ref_grid)

{
  REF_ADJ pRVar1;
  REF_DBL *pRVar2;
  REF_CELL ref_cell;
  byte bVar3;
  REF_STATUS RVar4;
  uint uVar5;
  REF_CELL *ppRVar6;
  REF_NODE pRVar7;
  REF_INT cell;
  long lVar8;
  ulong uVar9;
  REF_ADJ ref_adj;
  REF_INT nodes [27];
  long local_c0;
  REF_ADJ local_b8;
  REF_CELL *local_b0;
  REF_INT local_a8 [30];
  
  pRVar7 = ref_grid->node;
  if (pRVar7->max < 1) {
    bVar3 = 0;
  }
  else {
    uVar9 = 0;
    lVar8 = 2;
    bVar3 = 0;
    do {
      if ((((-1 < pRVar7->global[uVar9]) &&
           ((pRVar1 = ref_grid->cell[8]->ref_adj, (long)pRVar1->nnode <= (long)uVar9 ||
            (pRVar1->first[uVar9] == -1)))) &&
          ((pRVar1 = ref_grid->cell[9]->ref_adj, (long)pRVar1->nnode <= (long)uVar9 ||
           (pRVar1->first[uVar9] == -1)))) &&
         (((pRVar1 = ref_grid->cell[10]->ref_adj, (long)pRVar1->nnode <= (long)uVar9 ||
           (pRVar1->first[uVar9] == -1)) &&
          ((pRVar1 = ref_grid->cell[0xb]->ref_adj, (long)pRVar1->nnode <= (long)uVar9 ||
           (pRVar1->first[uVar9] == -1)))))) {
        pRVar2 = pRVar7->real;
        printf(" unused node %d: %e %e %e\n",pRVar2[lVar8 + -2],pRVar2[lVar8 + -1],pRVar2[lVar8],
               uVar9 & 0xffffffff);
        pRVar7 = ref_grid->node;
        bVar3 = 1;
      }
      uVar9 = uVar9 + 1;
      lVar8 = lVar8 + 0xf;
    } while ((long)uVar9 < (long)pRVar7->max);
  }
  ref_adj_create(&local_b8);
  local_b0 = ref_grid->cell;
  ppRVar6 = ref_grid->cell + 8;
  local_c0 = 8;
  do {
    ref_cell = *ppRVar6;
    if (0 < ref_cell->max) {
      cell = 0;
      do {
        RVar4 = ref_cell_nodes(ref_cell,cell,local_a8);
        if ((RVar4 == 0) && (0 < ref_cell->node_per)) {
          lVar8 = 0;
          do {
            uVar5 = ref_adj_add(local_b8,local_a8[lVar8],(int)local_c0 + cell * 4);
            if (uVar5 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_validation.c"
                     ,0x4f,"ref_validation_unused_node",(ulong)uVar5,"add");
              return uVar5;
            }
            lVar8 = lVar8 + 1;
          } while (lVar8 < ref_cell->node_per);
        }
        cell = cell + 1;
      } while (cell < ref_cell->max);
    }
    ppRVar6 = local_b0 + local_c0 + 1;
    local_c0 = local_c0 + 1;
  } while (local_c0 != 0x10);
  pRVar7 = ref_grid->node;
  if (0 < pRVar7->max) {
    uVar9 = 0;
    do {
      if ((-1 < pRVar7->global[uVar9]) &&
         (((long)local_b8->nnode <= (long)uVar9 || (local_b8->first[uVar9] == -1)))) {
        printf(" unused node %d\n",uVar9 & 0xffffffff);
        pRVar7 = ref_grid->node;
        bVar3 = 1;
      }
      uVar9 = uVar9 + 1;
    } while ((long)uVar9 < (long)pRVar7->max);
  }
  ref_adj_free(local_b8);
  return (uint)bVar3;
}

Assistant:

REF_FCN REF_STATUS ref_validation_unused_node(REF_GRID ref_grid) {
  REF_INT node;
  REF_BOOL problem;
  REF_ADJ ref_adj;
  REF_CELL ref_cell;
  REF_INT group, cell, nodes[REF_CELL_MAX_SIZE_PER];

  problem = REF_FALSE;
  each_ref_node_valid_node(ref_grid_node(ref_grid), node) {
    if (ref_adj_empty(ref_cell_adj(ref_grid_tet(ref_grid)), node) &&
        ref_adj_empty(ref_cell_adj(ref_grid_pyr(ref_grid)), node) &&
        ref_adj_empty(ref_cell_adj(ref_grid_pri(ref_grid)), node) &&
        ref_adj_empty(ref_cell_adj(ref_grid_hex(ref_grid)), node)) {
      problem = REF_TRUE;
      printf(" unused node %d: %e %e %e\n", node,
             ref_node_xyz(ref_grid_node(ref_grid), 0, node),
             ref_node_xyz(ref_grid_node(ref_grid), 1, node),
             ref_node_xyz(ref_grid_node(ref_grid), 2, node));
    }
  }

  ref_adj_create(&ref_adj);

  each_ref_grid_3d_ref_cell(ref_grid, group, ref_cell) {
    each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
      for (node = 0; node < ref_cell_node_per(ref_cell); node++)
        RSS(ref_adj_add(ref_adj, nodes[node], group + 4 * cell), "add");
    }
  }

  each_ref_node_valid_node(ref_grid_node(ref_grid), node) {
    if (ref_adj_empty(ref_adj, node)) {
      problem = REF_TRUE;
      printf(" unused node %d\n", node);
    }
  }

  ref_adj_free(ref_adj);

  return (problem ? REF_FAILURE : REF_SUCCESS);
}